

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_file_reader.hpp
# Opt level: O1

void __thiscall duckdb::BaseFileReader::BaseFileReader(BaseFileReader *this,OpenFileInfo *file_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  
  this->_vptr_BaseFileReader = (_func_int **)&PTR__BaseFileReader_004a5248;
  paVar1 = &(this->file).path.field_2;
  (this->file).path._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (file_p->path)._M_dataplus._M_p;
  paVar2 = &(file_p->path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(file_p->path).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->file).path.field_2 + 8) = uVar4;
  }
  else {
    (this->file).path._M_dataplus._M_p = pcVar3;
    (this->file).path.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->file).path._M_string_length = (file_p->path)._M_string_length;
  (file_p->path)._M_dataplus._M_p = (pointer)paVar2;
  (file_p->path)._M_string_length = 0;
  (file_p->path).field_2._M_local_buf[0] = '\0';
  (this->file).extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar5 = (file_p->extended_info).internal.
           super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6 = (file_p->extended_info).internal.
           super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (file_p->extended_info).internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->file).extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  (this->file).extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var6;
  (file_p->extended_info).internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->file_list_idx).index = 0xffffffffffffffff;
  (this->columns).
  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  .
  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->columns).
  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  .
  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->columns).
  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  .
  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->column_ids).column_ids.
  super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>.
  super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_ids).column_ids.
  super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>.
  super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_ids).column_ids.
  super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>.
  super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->column_indexes).super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_indexes).super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_indexes).super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filters).
  super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>.
  super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl = (TableFilterSet *)0x0;
  (this->expression_map)._M_h._M_buckets = &(this->expression_map)._M_h._M_single_bucket;
  (this->expression_map)._M_h._M_bucket_count = 1;
  (this->expression_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->expression_map)._M_h._M_element_count = 0;
  (this->expression_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->expression_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->expression_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->cast_map)._M_h._M_buckets = &(this->cast_map)._M_h._M_single_bucket;
  (this->cast_map)._M_h._M_bucket_count = 1;
  (this->cast_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->cast_map)._M_h._M_element_count = 0;
  (this->cast_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->cast_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->cast_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->deletion_filter).
  super_unique_ptr<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>_>._M_t.
  super___uniq_ptr_impl<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DeleteFilter_*,_std::default_delete<duckdb::DeleteFilter>_>.
  super__Head_base<0UL,_duckdb::DeleteFilter_*,_false>._M_head_impl = (DeleteFilter *)0x0;
  return;
}

Assistant:

explicit BaseFileReader(OpenFileInfo file_p) : file(std::move(file_p)) {
	}